

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CudaBackend.cpp
# Opt level: O3

void __thiscall xmrig::CudaBackend::CudaBackend(CudaBackend *this,Controller *controller)

{
  CudaBackendPrivate *this_00;
  Config *this_01;
  CudaConfig *ctx;
  
  (this->super_IBackend)._vptr_IBackend = (_func_int **)&PTR__CudaBackend_001ad3a0;
  this_00 = (CudaBackendPrivate *)operator_new(0x80);
  this_00->controller = controller;
  (this_00->status).m_errors = 0;
  (this_00->status).m_started = 0;
  (this_00->status).m_threads = 0;
  (this_00->status).m_ts = 0;
  (this_00->devices).super__Vector_base<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->devices).super__Vector_base<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->devices).super__Vector_base<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this_00->threads).
  super__Vector_base<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->threads).
  super__Vector_base<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->threads).
  super__Vector_base<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00->driverVersion = 0;
  this_00->runtimeVersion = 0;
  Workers<xmrig::CudaLaunchData>::Workers(&this_00->workers);
  this_01 = Base::config(&controller->super_Base);
  ctx = Config::cuda(this_01);
  CudaBackendPrivate::init(this_00,(EVP_PKEY_CTX *)ctx);
  this->d_ptr = this_00;
  Workers<xmrig::CudaLaunchData>::setBackend(&this_00->workers,&this->super_IBackend);
  return;
}

Assistant:

xmrig::CudaBackend::CudaBackend(Controller *controller) :
    d_ptr(new CudaBackendPrivate(controller))
{
    d_ptr->workers.setBackend(this);
}